

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O1

bool __thiscall
Js::SerializationCloner<Js::StreamWriter>::TryCloneObject
          (SerializationCloner<Js::StreamWriter> *this,SrcTypeId typeId,Src src,Dst *dst,
          SCADeepCloneType *deepClone)

{
  Var *ppvVar1;
  ulong uVar2;
  SharedContents *pSVar3;
  List<Js::SharedContents_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar4;
  code *pcVar5;
  ulong uVar6;
  RegexFlags RVar7;
  scaposition_t sVar8;
  BOOL BVar9;
  charcount_t len;
  int iVar10;
  Type len_00;
  RecyclableObject *obj;
  Engine *pEVar11;
  WebAssemblyMemory *this_00;
  ArrayBuffer *obj_00;
  WebAssemblySharedArrayBuffer *pWVar12;
  JavascriptString *this_01;
  JavascriptNumberObject *this_02;
  JavascriptBooleanObject *this_03;
  JavascriptStringObject *this_04;
  char16 *str_00;
  JavascriptRegExp *this_05;
  JavascriptDate *pJVar13;
  undefined4 extraout_var;
  SharedArrayBuffer *pSVar14;
  undefined4 *puVar15;
  WebAssemblyModule *pWVar16;
  ulong uVar17;
  uint *value;
  StreamWriter *pSVar18;
  Type TVar19;
  undefined4 uVar20;
  bool bVar21;
  uint local_60;
  uint local_5c;
  uint uStack_58;
  DWORD flags;
  InternalString str;
  uchar *bytes;
  
  obj = VarTo<Js::RecyclableObject>(src);
  str.m_content.ptr = (char16_t *)this;
  sVar8 = StreamWriter::GetPosition(this->m_writer);
  *deepClone = None;
  if (typeId == TypeIds_ArrayBuffer) {
    pEVar11 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
              ::GetEngine((ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                           *)str.m_content.ptr);
    TVar19 = str.m_content;
    ppvVar1 = pEVar11->m_transferableVars;
    uVar20 = 0;
    if (ppvVar1 == (Var *)0x0) {
      bVar21 = false;
    }
    else {
      uVar2 = pEVar11->m_cTransferableVars;
      bVar21 = uVar2 != 0;
      if ((bVar21) && (*ppvVar1 != src)) {
        uVar20 = 0;
        uVar6 = 1;
        do {
          uVar17 = uVar6;
          if (uVar2 == uVar17) goto LAB_00f21df4;
          uVar6 = uVar17 + 1;
        } while (ppvVar1[uVar17] != src);
        uVar20 = (undefined4)uVar17;
LAB_00f21df4:
        bVar21 = uVar17 < uVar2;
      }
    }
    if (!bVar21) goto LAB_00f21e31;
    uStack_58 = 0x1c;
    StreamWriter::Write<unsigned_int>
              (*(StreamWriter **)(str.m_content.ptr + 8),&stack0xffffffffffffffa8);
    pSVar18 = *(StreamWriter **)(TVar19.ptr + 8);
    uStack_58 = uVar20;
    value = &stack0xffffffffffffffa8;
    goto LAB_00f21e27;
  }
LAB_00f21e31:
  bVar21 = JavascriptOperators::IsObjectDetached(src);
  TVar19 = str.m_content;
  if (bVar21) {
    ScriptContextHolder::ThrowSCAObjectDetached((ScriptContextHolder *)str.m_content.ptr);
  }
  if (0x4a < (int)typeId) {
    if (typeId == TypeIds_SharedArrayBuffer) {
      pSVar14 = VarTo<Js::SharedArrayBuffer>(src);
      pSVar3 = pSVar14->sharedContents;
      iVar10 = (*(pSVar14->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                 super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                 [0x6d])(pSVar14);
      TVar19 = str.m_content;
      if ((bool)(char)iVar10 != pSVar3->isWebAssembly) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar21 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCASerialization.cpp"
                                     ,0xc3,
                                     "(buf->IsWebAssemblyArrayBuffer() == sharedContents->IsWebAssembly())"
                                     ,
                                     "buf->IsWebAssemblyArrayBuffer() == sharedContents->IsWebAssembly()"
                                    );
        if (!bVar21) goto LAB_00f2232e;
        *puVar15 = 0;
      }
      SharedContents::AddRef(pSVar3);
      pLVar4 = *(List<Js::SharedContents_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 **)(TVar19.ptr + 0xc);
      JsUtil::
      List<Js::SharedContents_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::EnsureArray(pLVar4,0);
      iVar10 = *(int *)(pLVar4 + 0x10);
      *(SharedContents **)(*(long *)(pLVar4 + 8) + (long)iVar10 * 8) = pSVar3;
      *(int *)(pLVar4 + 0x10) = iVar10 + 1;
      uStack_58 = 0x52;
      StreamWriter::Write<unsigned_int>(*(StreamWriter **)(TVar19.ptr + 8),&stack0xffffffffffffffa8)
      ;
      pSVar18 = *(StreamWriter **)(TVar19.ptr + 8);
      _uStack_58 = (_func_int **)pSVar3;
    }
    else {
      if (typeId == TypeIds_WebAssemblyModule) {
        pWVar16 = VarTo<Js::WebAssemblyModule>(src);
        TVar19 = str.m_content;
        uStack_58 = 0x55;
        StreamWriter::Write<unsigned_int>
                  (*(StreamWriter **)(str.m_content.ptr + 8),&stack0xffffffffffffffa8);
        bytes = (pWVar16->m_binaryBuffer).ptr;
        len_00 = pWVar16->m_binaryBufferLength;
        goto LAB_00f22306;
      }
      if (typeId != TypeIds_WebAssemblyMemory) goto switchD_00f21e60_caseD_1b;
      this_00 = VarTo<Js::WebAssemblyMemory>(src);
      obj_00 = (ArrayBuffer *)WebAssemblyMemory::GetBuffer(this_00);
      TVar19 = str.m_content;
      uStack_58 = 0x56;
      StreamWriter::Write<unsigned_int>
                (*(StreamWriter **)(str.m_content.ptr + 8),&stack0xffffffffffffffa8);
      uStack_58 = WebAssemblyMemory::GetInitialLength(this_00);
      StreamWriter::Write<unsigned_int>(*(StreamWriter **)(TVar19.ptr + 8),&stack0xffffffffffffffa8)
      ;
      uStack_58 = WebAssemblyMemory::GetMaximumLength(this_00);
      StreamWriter::Write<unsigned_int>(*(StreamWriter **)(TVar19.ptr + 8),&stack0xffffffffffffffa8)
      ;
      bVar21 = WebAssemblyMemory::IsSharedMemory(this_00);
      uStack_58 = (uint)bVar21;
      StreamWriter::Write<unsigned_int>(*(StreamWriter **)(TVar19.ptr + 8),&stack0xffffffffffffffa8)
      ;
      bVar21 = WebAssemblyMemory::IsSharedMemory(this_00);
      if (!bVar21) goto LAB_00f221ea;
      pWVar12 = VarTo<Js::WebAssemblySharedArrayBuffer,Js::ArrayBufferBase>
                          ((ArrayBufferBase *)obj_00);
      pSVar3 = (pWVar12->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer.sharedContents;
      SharedContents::AddRef(pSVar3);
      pLVar4 = *(List<Js::SharedContents_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 **)(TVar19.ptr + 0xc);
      JsUtil::
      List<Js::SharedContents_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::EnsureArray(pLVar4,0);
      iVar10 = *(int *)(pLVar4 + 0x10);
      *(SharedContents **)(*(long *)(pLVar4 + 8) + (long)iVar10 * 8) = pSVar3;
      *(int *)(pLVar4 + 0x10) = iVar10 + 1;
      pSVar18 = *(StreamWriter **)(TVar19.ptr + 8);
      _uStack_58 = (_func_int **)pSVar3;
    }
    StreamWriter::Write<long>(pSVar18,(long *)&stack0xffffffffffffffa8);
    goto LAB_00f2230b;
  }
  switch(typeId) {
  case TypeIds_Proxy:
    return false;
  case TypeIds_Function:
  case TypeIds_Error:
  case TypeIds_BigIntObject:
  case TypeIds_SIMDObject:
  case TypeIds_Arguments:
  case TypeIds_Int8Array:
  case TypeIds_Uint8Array:
  case TypeIds_Uint8ClampedArray:
  case TypeIds_Int16Array:
  case TypeIds_Uint16Array:
  case TypeIds_Int32Array:
  case TypeIds_Uint32Array:
  case TypeIds_Float32Array:
  case TypeIds_Float64Array:
  case TypeIds_Int64Array:
  case TypeIds_Uint64Array:
  case TypeIds_CharArray:
  case TypeIds_BoolArray:
  case TypeIds_EngineInterfaceObject:
  case TypeIds_DataView:
  case TypeIds_DataView|TypeIds_Null:
    goto switchD_00f21e60_caseD_1b;
  case TypeIds_Object:
    uStack_58 = 0x1b;
    StreamWriter::Write<unsigned_int>
              (*(StreamWriter **)(str.m_content.ptr + 8),&stack0xffffffffffffffa8);
  case TypeIds_Array:
  case TypeIds_NativeIntArray:
  case TypeIds_ArrayLast:
  case TypeIds_ArrayLastWithES5:
    *deepClone = Object;
    break;
  case TypeIds_CopyOnAccessNativeIntArray:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar21 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCASerialization.cpp"
                                 ,0xfd,"(false)","false");
    if (!bVar21) {
LAB_00f2232e:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar15 = 0;
    goto switchD_00f21e60_caseD_1b;
  case TypeIds_Date:
    uStack_58 = 0x17;
    StreamWriter::Write<unsigned_int>
              (*(StreamWriter **)(str.m_content.ptr + 8),&stack0xffffffffffffffa8);
    pSVar18 = *(StreamWriter **)(TVar19.ptr + 8);
    pJVar13 = VarTo<Js::JavascriptDate>(src);
    _uStack_58 = (_func_int **)DateImplementation::GetMilliSeconds(&pJVar13->m_date);
    goto LAB_00f22124;
  case TypeIds_RegEx:
    this_05 = VarTo<Js::JavascriptRegExp>(src);
    JavascriptRegExp::GetSource((JavascriptRegExp *)&stack0xffffffffffffffa8);
    RVar7 = JavascriptRegExp::GetFlags(this_05);
    TVar19 = str.m_content;
    value = &local_5c;
    local_5c = (uint)RVar7;
    local_60 = 0x1a;
    StreamWriter::Write<unsigned_int>(*(StreamWriter **)(str.m_content.ptr + 8),&local_60);
    Write((SerializationCloner<Js::StreamWriter> *)TVar19.ptr,
          (char16 *)((ulong)((uint)(byte)flags * 2) + str._0_8_),uStack_58);
    pSVar18 = *(StreamWriter **)(TVar19.ptr + 8);
    goto LAB_00f21e27;
  case TypeIds_BooleanObject:
    this_03 = VarTo<Js::JavascriptBooleanObject>(src);
    BVar9 = JavascriptBooleanObject::GetValue(this_03);
    value = &stack0xffffffffffffffa8;
    uStack_58 = (BVar9 == 0) + 0x15;
    pSVar18 = *(StreamWriter **)(str.m_content.ptr + 8);
LAB_00f21e27:
    StreamWriter::Write<unsigned_int>(pSVar18,value);
    break;
  case TypeIds_NumberObject:
    uStack_58 = 0x18;
    StreamWriter::Write<unsigned_int>
              (*(StreamWriter **)(str.m_content.ptr + 8),&stack0xffffffffffffffa8);
    pSVar18 = *(StreamWriter **)(TVar19.ptr + 8);
    this_02 = VarTo<Js::JavascriptNumberObject>(src);
    _uStack_58 = (_func_int **)JavascriptNumberObject::GetValue(this_02);
LAB_00f22124:
    StreamWriter::Write<double>(pSVar18,(double *)&stack0xffffffffffffffa8);
    break;
  case TypeIds_StringObject:
    this_04 = VarTo<Js::JavascriptStringObject>(src);
    this_01 = JavascriptStringObject::InternalUnwrap(this_04);
    uStack_58 = 0x19;
LAB_00f2201f:
    TVar19.ptr = str.m_content.ptr;
    StreamWriter::Write<unsigned_int>
              (*(StreamWriter **)(str.m_content.ptr + 8),&stack0xffffffffffffffa8);
    str_00 = JavascriptString::GetString(this_01);
    len = JavascriptString::GetLength(this_01);
    Write((SerializationCloner<Js::StreamWriter> *)TVar19.ptr,str_00,len);
    break;
  case TypeIds_ArrayBuffer:
    obj_00 = VarTo<Js::ArrayBuffer>(src);
    TVar19 = str.m_content;
    uStack_58 = 0x3c;
    StreamWriter::Write<unsigned_int>
              (*(StreamWriter **)(str.m_content.ptr + 8),&stack0xffffffffffffffa8);
LAB_00f221ea:
    iVar10 = (*(obj_00->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
               super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
               [0x72])(obj_00);
    bytes = (uchar *)CONCAT44(extraout_var,iVar10);
    len_00 = (*(obj_00->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
               super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
               [0x71])(obj_00);
LAB_00f22306:
    Write((SerializationCloner<Js::StreamWriter> *)TVar19.ptr,bytes,len_00);
    break;
  case TypeIds_Map:
    uStack_58 = 0x50;
    StreamWriter::Write<unsigned_int>
              (*(StreamWriter **)(str.m_content.ptr + 8),&stack0xffffffffffffffa8);
    *deepClone = Map;
    break;
  case TypeIds_Set:
    uStack_58 = 0x51;
    StreamWriter::Write<unsigned_int>
              (*(StreamWriter **)(str.m_content.ptr + 8),&stack0xffffffffffffffa8);
    *deepClone = Set;
    break;
  default:
    if (typeId == TypeIds_String) {
      this_01 = VarTo<Js::JavascriptString,Js::RecyclableObject>(obj);
      uStack_58 = 8;
      goto LAB_00f2201f;
    }
switchD_00f21e60_caseD_1b:
    if (typeId == TypeIds_DataView || typeId - TypeIds_Int8Array < 9) {
      WriteTypedArray((SerializationCloner<Js::StreamWriter> *)str.m_content.ptr,typeId,src);
    }
    else {
      *deepClone = HostObject;
    }
  }
LAB_00f2230b:
  *dst = sVar8;
  return true;
}

Assistant:

bool SerializationCloner<Writer>::TryCloneObject(SrcTypeId typeId, Src src, Dst* dst, SCADeepCloneType* deepClone)
    {
        RecyclableObject* obj = VarTo<RecyclableObject>(src);
        scaposition_t beginPos = m_writer->GetPosition();
        *deepClone = SCADeepCloneType::None;

        size_t transferredIndex = 0;
        if (this->CanBeTransferred(typeId) && this->GetEngine()->TryGetTransferredOrShared(src, &transferredIndex))
        {
            WriteTypeId(SCA_Transferable);
            m_writer->Write((uint32)transferredIndex);
        }
        else if (JavascriptOperators::IsObjectDetached(src))
        {
            //Object is detached, throw error
            this->ThrowSCAObjectDetached();
        }
        else
        {
            switch (typeId)
            {
            case TypeIds_String: // Clone string value as object type to resolve multiple references
                {
                    JavascriptString* str = VarTo<JavascriptString>(obj);
                    WriteTypeId(SCA_StringValue);
                    Write(str->GetString(), str->GetLength());
                }
                break;

            case TypeIds_Object:
                {
                    WriteTypeId(SCA_Object);
                    *deepClone = SCADeepCloneType::Object;
                }
                break;

            case TypeIds_Proxy:
                {
                // Currently SCA algorithm does not support proxy. We'll see 
                // if the spec will be updated. I don't support QueryObjectInterface in proxy
                // so we don't want to go through the default code path.
                    return false;
                }
            case TypeIds_Array:
            case TypeIds_ES5Array:
            case TypeIds_NativeIntArray:
            case TypeIds_NativeFloatArray:
                {
                    // Postpone writing to CloneProperties
                    *deepClone = SCADeepCloneType::Object;
                }
                break;

            case TypeIds_Date:
                {
                    WriteTypeId(SCA_DateObject);
                    m_writer->Write(VarTo<JavascriptDate>(src)->GetTime());
                }
                break;

            case TypeIds_RegEx:
                {
                    JavascriptRegExp* regex = VarTo<JavascriptRegExp>(src);
                    InternalString str = regex->GetSource();
                    DWORD flags = static_cast<DWORD>(regex->GetFlags());
                    WriteTypeId(SCA_RegExpObject);
                    Write(str.GetBuffer(), str.GetLength());
                    m_writer->Write(flags);
                }
                break;

            case TypeIds_BooleanObject:
                WriteTypeId(VarTo<JavascriptBooleanObject>(src)->GetValue() ?
                    SCA_BooleanTrueObject : SCA_BooleanFalseObject);
                break;

            case TypeIds_NumberObject:
                {
                    WriteTypeId(SCA_NumberObject);
                    m_writer->Write(VarTo<JavascriptNumberObject>(src)->GetValue());
                }
                break;

            case TypeIds_StringObject:
                {
                    JavascriptString* str = VarTo<JavascriptStringObject>(src)->Unwrap();
                    WriteTypeId(SCA_StringObject);
                    Write(str->GetString(), str->GetLength());
                }
                break;

            case TypeIds_ArrayBuffer:
                {
                    ArrayBuffer* buf = VarTo<ArrayBuffer>(src);
                    WriteTypeId(SCA_ArrayBuffer);
                    Write(buf->GetBuffer(), buf->GetByteLength());
                }
                break;

            case TypeIds_SharedArrayBuffer:
                {
                    // TBD

                    //SCAContextType contextType;
                    //if (FAILED(this->m_pSCAContext->GetContext(&contextType)))
                    //{
                    //    return false;
                    //}
                    //
                    //if(contextType == SCAContext_CrossProcess || contextType == SCAContext_Persist)
                    //{
                    //    return false;
                    //}

                    SharedArrayBuffer* buf = VarTo<SharedArrayBuffer>(src);
                    SharedContents* sharedContents = buf->GetSharedContents();
                    Assert(buf->IsWebAssemblyArrayBuffer() == sharedContents->IsWebAssembly());
                    sharedContents->AddRef();
                    this->m_sharedContentsrList->Add(sharedContents);
                    WriteTypeId(SCA_SharedArrayBuffer);
                    m_writer->Write((intptr_t)sharedContents);
                }
                break;

            case TypeIds_Map:
                {
                    WriteTypeId(SCA_Map);
                    *deepClone = SCADeepCloneType::Map;
                }
                break;

            case TypeIds_Set:
                {
                    WriteTypeId(SCA_Set);
                    *deepClone = SCADeepCloneType::Set;
                }
                break;

#ifdef ENABLE_WASM
            case TypeIds_WebAssemblyModule:
                {
                    WebAssemblyModule* wasmModule = VarTo<WebAssemblyModule>(src);
                    WriteTypeId(SCA_WebAssemblyModule);
                    Write(wasmModule->GetBinaryBuffer(), wasmModule->GetBinaryBufferLength());
                }
                break;
            case TypeIds_WebAssemblyMemory:
            {
                WebAssemblyMemory* wasmMem = VarTo<WebAssemblyMemory>(src);
                ArrayBufferBase* buffer = wasmMem->GetBuffer();
                WriteTypeId(SCA_WebAssemblyMemory);
                Write(wasmMem->GetInitialLength());
                Write(wasmMem->GetMaximumLength());
#ifdef ENABLE_WASM_THREADS
                Write((uint32)wasmMem->IsSharedMemory());
                if (wasmMem->IsSharedMemory())
                {
                    WebAssemblySharedArrayBuffer* buf = VarTo<WebAssemblySharedArrayBuffer>(buffer);
                    SharedContents* sharedContents = buf->GetSharedContents();
                    sharedContents->AddRef();
                    this->m_sharedContentsrList->Add(sharedContents);
                    m_writer->Write((intptr_t)sharedContents);
                }
                else
#endif
                {
                    Write(buffer->GetBuffer(), buffer->GetByteLength());
                }
                break;
            }
#endif

#if ENABLE_COPYONACCESS_ARRAY
            case TypeIds_CopyOnAccessNativeIntArray:
                Assert(false);
                // fall-through
#endif

            default:
                if (IsTypedArray(typeId))
                {
                    WriteTypedArray(typeId, src);
                }
                else
                {
                    // Try Host Object
                    *deepClone = SCADeepCloneType::HostObject;
                }
                break;
            }
        }

        *dst = beginPos;
        return true;
    }